

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O1

bool __thiscall
OpenMesh::IO::_OFFReader_::read_binary
          (_OFFReader_ *this,istream *_in,BaseImporter *_bi,Options *_opt,bool param_4)

{
  byte *pbVar1;
  uint uVar2;
  BaseHandle BVar3;
  BaseHandle BVar4;
  BaseHandle BVar5;
  BaseHandle BVar6;
  char cVar7;
  uint uVar8;
  BaseHandle BVar9;
  float fVar10;
  size_type *local_d8;
  string header;
  Vec3f v;
  Vec3f n;
  Vec2f t;
  BaseHandle local_88;
  float local_84;
  Vec4f cAf;
  Vec3f cf;
  VHandles vhandles;
  BaseHandle local_34 [2];
  uint32_t tmp;
  
  cf.super_VectorDataT<float,_3>.values_[1] = 0.0;
  cf.super_VectorDataT<float,_3>.values_[2] = 0.0;
  vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8 = &header._M_string_length;
  header._M_dataplus._M_p = (pointer)0x0;
  header._M_string_length._0_1_ = 0;
  cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)_in + -0x18) + (char)_in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(_in,(string *)&local_d8,cVar7);
  std::istream::read((char *)_in,(long)local_34);
  BVar9.idx_ = local_34[0].idx_;
  std::istream::read((char *)_in,(long)local_34);
  BVar3.idx_ = local_34[0].idx_;
  std::istream::read((char *)_in,(long)local_34);
  (*_bi->_vptr_BaseImporter[0x1b])
            (_bi,(ulong)(uint)BVar9.idx_,(ulong)(uint)(BVar9.idx_ * 3),(ulong)(uint)BVar3.idx_);
  while (((float)BVar9.idx_ != 0.0 && (((byte)_in[*(long *)(*(long *)_in + -0x18) + 0x20] & 2) == 0)
         )) {
    std::istream::read((char *)_in,(long)local_34);
    header.field_2._12_4_ = local_34[0].idx_;
    std::istream::read((char *)_in,(long)local_34);
    std::istream::read((char *)_in,(long)local_34);
    v.super_VectorDataT<float,_3>.values_[0] = (float)local_34[0].idx_;
    uVar8 = (*_bi->_vptr_BaseImporter[2])(_bi,(undefined1 *)((long)&header.field_2 + 0xc));
    if (((this->options_).flags_ & 0x10) != 0) {
      std::istream::read((char *)_in,(long)local_34);
      v.super_VectorDataT<float,_3>.values_[1] = (float)local_34[0].idx_;
      std::istream::read((char *)_in,(long)local_34);
      v.super_VectorDataT<float,_3>.values_[2] = (float)local_34[0].idx_;
      std::istream::read((char *)_in,(long)local_34);
      n.super_VectorDataT<float,_3>.values_[0] = (float)local_34[0].idx_;
      if (((this->userOptions_).flags_ & 0x10) != 0) {
        (*_bi->_vptr_BaseImporter[8])(_bi,(ulong)uVar8,v.super_VectorDataT<float,_3>.values_ + 1);
      }
    }
    uVar2 = (this->options_).flags_;
    if ((uVar2 & 0x20) != 0) {
      if (((this->userOptions_).flags_ & 0x1000) == 0) {
        if ((uVar2 >> 0xb & 1) == 0) {
          std::istream::read((char *)_in,(long)local_34);
          BVar4.idx_ = local_34[0].idx_;
          std::istream::read((char *)_in,(long)local_34);
          BVar5.idx_ = local_34[0].idx_;
          std::istream::read((char *)_in,(long)local_34);
          BVar6.idx_ = local_34[0].idx_;
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            local_34[0].idx_._1_1_ = (char)BVar5.idx_;
            local_34[0].idx_._0_1_ = (char)BVar4.idx_;
            local_34[0].idx_._3_1_ = SUB41(BVar6.idx_,3);
            local_34[0].idx_._2_1_ = (char)BVar6.idx_;
            (*_bi->_vptr_BaseImporter[9])(_bi,(ulong)uVar8,local_34);
          }
        }
        else {
          std::istream::read((char *)_in,(long)local_34);
          BVar4.idx_ = local_34[0].idx_;
          std::istream::read((char *)_in,(long)local_34);
          BVar5.idx_ = local_34[0].idx_;
          std::istream::read((char *)_in,(long)local_34);
          BVar6.idx_ = local_34[0].idx_;
          std::istream::read((char *)_in,(long)local_34);
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            local_34[0].idx_ =
                 CONCAT13((char)local_34[0].idx_,
                          CONCAT12((char)BVar6.idx_,CONCAT11((char)BVar5.idx_,(char)BVar4.idx_)));
            (*_bi->_vptr_BaseImporter[10])(_bi,(ulong)uVar8,local_34);
          }
        }
      }
      else {
        pbVar1 = (byte *)((long)&_opt->flags_ + 1);
        *pbVar1 = *pbVar1 | 0x10;
        if (((this->options_).flags_ & 0x800) == 0) {
          std::istream::read((char *)_in,(long)local_34);
          cAf.super_VectorDataT<float,_4>.field_0._12_4_ = local_34[0].idx_;
          std::istream::read((char *)_in,(long)local_34);
          std::istream::read((char *)_in,(long)local_34);
          cf.super_VectorDataT<float,_3>.values_[0] = (float)local_34[0].idx_;
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            (*_bi->_vptr_BaseImporter[0xb])
                      (_bi,(ulong)uVar8,
                       (undefined1 *)((long)&cAf.super_VectorDataT<float,_4>.field_0 + 0xc));
          }
        }
        else {
          std::istream::read((char *)_in,(long)local_34);
          local_88.idx_ = local_34[0].idx_;
          std::istream::read((char *)_in,(long)local_34);
          local_84 = (float)local_34[0].idx_;
          std::istream::read((char *)_in,(long)local_34);
          cAf.super_VectorDataT<float,_4>.field_0._0_4_ = local_34[0].idx_;
          std::istream::read((char *)_in,(long)local_34);
          cAf.super_VectorDataT<float,_4>.field_0.m128[1] = (float)local_34[0].idx_;
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            (*_bi->_vptr_BaseImporter[0xc])(_bi,(ulong)uVar8,&local_88);
          }
        }
      }
    }
    if (((this->options_).flags_ & 0x40) != 0) {
      std::istream::read((char *)_in,(long)local_34);
      n.super_VectorDataT<float,_3>.values_[1] = (float)local_34[0].idx_;
      std::istream::read((char *)_in,(long)local_34);
      n.super_VectorDataT<float,_3>.values_[2] = (float)local_34[0].idx_;
      if (((this->userOptions_).flags_ & 0x40) != 0) {
        (*_bi->_vptr_BaseImporter[0xd])(_bi,(ulong)uVar8,n.super_VectorDataT<float,_3>.values_ + 1);
      }
    }
    BVar9.idx_ = BVar9.idx_ + -1;
  }
  if ((float)BVar3.idx_ != 0.0) {
    fVar10 = 0.0;
    do {
      std::istream::read((char *)_in,(long)local_34);
      if ((float)local_34[0].idx_ == 4.2039e-45) {
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                  ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                   (cf.super_VectorDataT<float,_3>.values_ + 1),3);
        std::istream::read((char *)_in,(long)local_34);
        BVar9.idx_ = local_34[0].idx_;
        std::istream::read((char *)_in,(long)local_34);
        BVar4.idx_ = local_34[0].idx_;
        std::istream::read((char *)_in,(long)local_34);
        *(int *)cf.super_VectorDataT<float,_3>.values_._4_8_ = BVar9.idx_;
        *(int *)(cf.super_VectorDataT<float,_3>.values_._4_8_ + 4) = BVar4.idx_;
        *(int *)(cf.super_VectorDataT<float,_3>.values_._4_8_ + 8) = local_34[0].idx_;
      }
      else {
        BVar9.idx_ = local_34[0].idx_;
        if (vhandles.
            super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)cf.super_VectorDataT<float,_3>.values_._4_8_) {
          vhandles.
          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)cf.super_VectorDataT<float,_3>.values_._4_8_;
        }
        for (; (float)BVar9.idx_ != 0.0; BVar9.idx_ = BVar9.idx_ + -1) {
          std::istream::read((char *)_in,(long)local_34);
          if (vhandles.
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
              _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
            std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
            _M_realloc_insert<OpenMesh::VertexHandle>
                      ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                       (cf.super_VectorDataT<float,_3>.values_ + 1),(iterator)0x0,
                       (VertexHandle *)local_34);
          }
          else {
            ((vhandles.
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
              _M_impl.super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = local_34[0].idx_;
            vhandles.
            super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 vhandles.
                 super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
      }
      uVar8 = (*_bi->_vptr_BaseImporter[4])(_bi,cf.super_VectorDataT<float,_3>.values_ + 1);
      if (((uint)_opt->flags_ >> 9 & 1) != 0) {
        if (((this->userOptions_).flags_ & 0x1000) == 0) {
          if (((this->options_).flags_ & 0x800) == 0) {
            std::istream::read((char *)_in,(long)local_34);
            BVar9.idx_ = local_34[0].idx_;
            std::istream::read((char *)_in,(long)local_34);
            BVar4.idx_ = local_34[0].idx_;
            std::istream::read((char *)_in,(long)local_34);
            BVar5.idx_ = local_34[0].idx_;
            if (((this->userOptions_).flags_ & 0x200) != 0) {
              local_34[0].idx_._1_1_ = (char)BVar4.idx_;
              local_34[0].idx_._0_1_ = (char)BVar9.idx_;
              local_34[0].idx_._3_1_ = SUB41(BVar5.idx_,3);
              local_34[0].idx_._2_1_ = (char)BVar5.idx_;
              (*_bi->_vptr_BaseImporter[0x14])(_bi,(ulong)uVar8,local_34);
            }
          }
          else {
            std::istream::read((char *)_in,(long)local_34);
            BVar9.idx_ = local_34[0].idx_;
            std::istream::read((char *)_in,(long)local_34);
            BVar4.idx_ = local_34[0].idx_;
            std::istream::read((char *)_in,(long)local_34);
            BVar5.idx_ = local_34[0].idx_;
            std::istream::read((char *)_in,(long)local_34);
            if (((this->userOptions_).flags_ & 0x200) != 0) {
              local_34[0].idx_ =
                   CONCAT13((char)local_34[0].idx_,
                            CONCAT12((char)BVar5.idx_,CONCAT11((char)BVar4.idx_,(char)BVar9.idx_)));
              (*_bi->_vptr_BaseImporter[0x15])(_bi,(ulong)uVar8,local_34);
            }
          }
        }
        else {
          _opt->flags_ = _opt->flags_ | 0x1000;
          if (((this->options_).flags_ & 0x800) == 0) {
            std::istream::read((char *)_in,(long)local_34);
            cAf.super_VectorDataT<float,_4>.field_0._12_4_ = local_34[0].idx_;
            std::istream::read((char *)_in,(long)local_34);
            std::istream::read((char *)_in,(long)local_34);
            cf.super_VectorDataT<float,_3>.values_[0] = (float)local_34[0].idx_;
            if (((this->userOptions_).flags_ & 0x200) != 0) {
              (*_bi->_vptr_BaseImporter[0x16])
                        (_bi,(ulong)uVar8,
                         (undefined1 *)((long)&cAf.super_VectorDataT<float,_4>.field_0 + 0xc));
            }
          }
          else {
            std::istream::read((char *)_in,(long)local_34);
            local_88.idx_ = local_34[0].idx_;
            std::istream::read((char *)_in,(long)local_34);
            local_84 = (float)local_34[0].idx_;
            std::istream::read((char *)_in,(long)local_34);
            cAf.super_VectorDataT<float,_4>.field_0._0_4_ = local_34[0].idx_;
            std::istream::read((char *)_in,(long)local_34);
            cAf.super_VectorDataT<float,_4>.field_0._4_4_ = local_34[0].idx_;
            if (((this->userOptions_).flags_ & 0x200) != 0) {
              (*_bi->_vptr_BaseImporter[0x17])(_bi,(ulong)uVar8,&local_88);
            }
          }
        }
      }
      fVar10 = (float)((int)fVar10 + 1);
    } while (fVar10 != (float)BVar3.idx_);
  }
  if (local_d8 != &header._M_string_length) {
    operator_delete(local_d8);
  }
  if (cf.super_VectorDataT<float,_3>.values_._4_8_ != 0) {
    operator_delete((void *)cf.super_VectorDataT<float,_3>.values_._4_8_);
  }
  return true;
}

Assistant:

bool
_OFFReader_::read_binary(std::istream& _in, BaseImporter& _bi, Options& _opt, bool /*_swap*/) const
{
  unsigned int            i, j, k, l, idx;
  unsigned int            nV, nF, dummy;
  OpenMesh::Vec3f         v, n;
  OpenMesh::Vec3i         c;
  OpenMesh::Vec4i         cA;
  OpenMesh::Vec3f         cf;
  OpenMesh::Vec4f         cAf;
  OpenMesh::Vec2f         t;
  BaseImporter::VHandles  vhandles;
  VertexHandle            vh;

  // read header line
  std::string header;
  std::getline(_in,header);

  // + #Vertice, #Faces, #Edges
  readValue(_in, nV);
  readValue(_in, nF);
  readValue(_in, dummy);

  _bi.reserve(nV, 3*nV, nF);

  // read vertices: coord [hcoord] [normal] [color] [texcoord]
  for (i=0; i<nV && !_in.eof(); ++i)
  {
    // Always read Vertex
    readValue(_in, v[0]);
    readValue(_in, v[1]);
    readValue(_in, v[2]);

    vh = _bi.add_vertex(v);

    if ( options_.vertex_has_normal() ) {
      readValue(_in, n[0]);
      readValue(_in, n[1]);
      readValue(_in, n[2]);

      if ( userOptions_.vertex_has_normal() )
        _bi.set_normal(vh, n);
    }

    if ( options_.vertex_has_color() ) {
      if ( userOptions_.color_is_float() ) {
        _opt += Options::ColorFloat;
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cAf[0]);
          readValue(_in, cAf[1]);
          readValue(_in, cAf[2]);
          readValue(_in, cAf[3]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, cAf );
        }else{

          //without alpha
          readValue(_in, cf[0]);
          readValue(_in, cf[1]);
          readValue(_in, cf[2]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, cf );
        }
      } else {
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cA[0]);
          readValue(_in, cA[1]);
          readValue(_in, cA[2]);
          readValue(_in, cA[3]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, Vec4uc( cA ) );
        }else{
          //without alpha
          readValue(_in, c[0]);
          readValue(_in, c[1]);
          readValue(_in, c[2]);

          if ( userOptions_.vertex_has_color() )
            _bi.set_color( vh, Vec3uc( c ) );
        }
      }
    }

    if ( options_.vertex_has_texcoord()) {
      readValue(_in, t[0]);
      readValue(_in, t[1]);

      if ( userOptions_.vertex_has_texcoord() )
        _bi.set_texcoord(vh, t);
    }
  }

  // faces
  // #N <v1> <v2> .. <v(n-1)> [color spec]
  // So far color spec is unsupported!
  for (i=0; i<nF; ++i)
  {
    readValue(_in, nV);

    if (nV == 3)
    {
      vhandles.resize(3);
      readValue(_in, j);
      readValue(_in, k);
      readValue(_in, l);

      vhandles[0] = VertexHandle(j);
      vhandles[1] = VertexHandle(k);
      vhandles[2] = VertexHandle(l);
    } else {
      vhandles.clear();
      for (j=0; j<nV; ++j)
      {
         readValue(_in, idx);
         vhandles.push_back(VertexHandle(idx));
      }
    }

    FaceHandle fh = _bi.add_face(vhandles);

    //face color
    if ( _opt.face_has_color() ) {
      if ( userOptions_.color_is_float() ) {
        _opt += Options::ColorFloat;
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cAf[0]);
          readValue(_in, cAf[1]);
          readValue(_in, cAf[2]);
          readValue(_in, cAf[3]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh , cAf );
        }else{
          //without alpha
          readValue(_in, cf[0]);
          readValue(_in, cf[1]);
          readValue(_in, cf[2]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh, cf );
        }
      } else {
        //with alpha
        if ( options_.color_has_alpha() ){
          readValue(_in, cA[0]);
          readValue(_in, cA[1]);
          readValue(_in, cA[2]);
          readValue(_in, cA[3]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh , Vec4uc( cA ) );
        }else{
          //without alpha
          readValue(_in, c[0]);
          readValue(_in, c[1]);
          readValue(_in, c[2]);

          if ( userOptions_.face_has_color() )
            _bi.set_color( fh, Vec3uc( c ) );
        }
      }
    }

  }

  // File was successfully parsed.
  return true;

}